

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::Begin(DeviceContextVkImpl *this,Uint32 ImmediateContextId)

{
  bool bVar1;
  Uint32 UVar2;
  Char *pCVar3;
  RenderDeviceVkImpl *this_00;
  QueryManagerVk *pQVar4;
  char (*in_RCX) [46];
  undefined1 local_90 [8];
  string msg_2;
  undefined1 local_68 [7];
  SoftwareQueueIndex CommandQueueId;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  Uint32 ImmediateContextId_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._12_4_ = ImmediateContextId;
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  if (!bVar1) {
    FormatString<char[53]>
              ((string *)local_38,
               (char (*) [53])"Begin() should only be called for deferred contexts.");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [46])0xce;
    DebugAssertionFailed
              (pCVar3,"Begin",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xce);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsRecordingDeferredCommands
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  if (bVar1) {
    FormatString<char[101]>
              ((string *)local_68,
               (char (*) [101])
               "This context is already recording commands. Call FinishCommandList() before beginning new recording."
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [46])0xcf;
    DebugAssertionFailed
              (pCVar3,"Begin",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xcf);
    std::__cxx11::string::~string((string *)local_68);
  }
  IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>::
  IndexWrapper<unsigned_int,unsigned_int>
            ((IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag> *)
             (msg_2.field_2._M_local_buf + 0xf),msg.field_2._12_4_);
  msg_2.field_2._M_local_buf[0xe] = msg_2.field_2._M_local_buf[0xf];
  PrepareCommandPool(this,(SoftwareQueueIndex)msg_2.field_2._M_local_buf[0xf]);
  msg_2.field_2._M_local_buf[0xd] = (char)msg.field_2._12_4_;
  IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>::operator=
            ((IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag> *)
             &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DstImmediateContextId,
             (uchar *)(msg_2.field_2._M_local_buf + 0xd));
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int
                    ((IndexWrapper *)
                     &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DstImmediateContextId)
  ;
  if (UVar2 != msg.field_2._12_4_) {
    FormatString<char[26],char[46]>
              ((string *)local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_DstImmediateContextId == ImmediateContextId",in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Begin",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd3);
    std::__cxx11::string::~string((string *)local_90);
  }
  this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                      (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  pQVar4 = RenderDeviceVkImpl::GetQueryMgr
                     (this_00,(SoftwareQueueIndex)msg_2.field_2._M_local_buf[0xf]);
  this->m_pQueryMgr = pQVar4;
  return;
}

Assistant:

void DeviceContextVkImpl::Begin(Uint32 ImmediateContextId)
{
    DEV_CHECK_ERR(IsDeferred(), "Begin() should only be called for deferred contexts.");
    DEV_CHECK_ERR(!IsRecordingDeferredCommands(), "This context is already recording commands. Call FinishCommandList() before beginning new recording.");
    const SoftwareQueueIndex CommandQueueId{ImmediateContextId};
    PrepareCommandPool(CommandQueueId);
    m_DstImmediateContextId = static_cast<Uint8>(ImmediateContextId);
    VERIFY_EXPR(m_DstImmediateContextId == ImmediateContextId);
    m_pQueryMgr = &m_pDevice->GetQueryMgr(CommandQueueId);
}